

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O3

void __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::Consume::clean_dead_elements(Consume *this)

{
  uintptr_t uVar1;
  uint uVar2;
  ControlBlock *pCVar3;
  
  uVar2 = (uint)this->m_next_ptr;
  while ((uVar2 & 3) == 2) {
    advance_head(this);
    pCVar3 = (ControlBlock *)(this->m_next_ptr & 0xfffffffffffffff0);
    this->m_control = pCVar3;
    uVar1 = pCVar3->m_next;
    this->m_next_ptr = uVar1;
    uVar2 = (uint)uVar1;
  }
  return;
}

Assistant:

void clean_dead_elements() noexcept
                {
                    while ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                    {
                        advance_head();
                        move_next();
                    }
                }